

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EnsureNoRedeclarations
          (ByteCodeGenerator *this,ParseNodeBlock *pnodeBlock,FuncInfo *funcInfo)

{
  OpCode OVar1;
  ParseNode *pPVar2;
  code *pcVar3;
  anon_class_8_1_8991fb9c aVar4;
  bool bVar5;
  ushort uVar6;
  PropertyId propertyId;
  uint index;
  undefined4 *puVar7;
  ByteCodeGenerator *pBVar8;
  FuncInfo *this_00;
  ParseNodeVar *pPVar9;
  ParseNodePtr *ppPVar10;
  ParseNodeCatch *pPVar11;
  ParseNodeBlock *pPVar12;
  ParseNodeFnc *pPVar13;
  ParseNodeWith *pPVar14;
  Symbol *pSVar15;
  anon_class_8_1_8991fb9c local_50;
  anon_class_8_1_8991fb9c emitRedeclCheck;
  
  if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1661,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
    if (!bVar5) goto LAB_00762542;
    *puVar7 = 0;
  }
  if (((pnodeBlock->field_0x5c & 3) != 0) &&
     (pnodeBlock->scope->scopeType != ScopeType_GlobalEvalBlock)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1662,
                       "(pnodeBlock->blockType == PnodeBlockType::Global || pnodeBlock->scope->GetScopeType() == ScopeType_GlobalEvalBlock)"
                       ,
                       "pnodeBlock->blockType == PnodeBlockType::Global || pnodeBlock->scope->GetScopeType() == ScopeType_GlobalEvalBlock"
                      );
    if (!bVar5) goto LAB_00762542;
    *puVar7 = 0;
  }
  if ((this->flags & 0x800) == 0) {
    if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop == knopBlock) {
      emitRedeclCheck.this = (ByteCodeGenerator *)__tls_get_addr(&PTR_013e5f18);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      pBVar8 = (ByteCodeGenerator *)__tls_get_addr(&PTR_013e5f18);
      *(undefined4 *)&pBVar8->scriptContext = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeGenerator.h"
                         ,0x1ef,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
      if (!bVar5) {
LAB_00762542:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *(undefined4 *)&pBVar8->scriptContext = 0;
      emitRedeclCheck.this = pBVar8;
    }
    ppPVar10 = &pnodeBlock->pnodeLexVars;
    while (pPVar2 = *ppPVar10, pPVar2 != (ParseNode *)0x0) {
      this_00 = TopFuncInfo(this);
      pPVar9 = ParseNode::AsParseNodeVar(pPVar2);
      pSVar15 = pPVar9->sym;
      if ((pSVar15->field_0x42 & 8) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        aVar4 = emitRedeclCheck;
        *(undefined4 *)&(emitRedeclCheck.this)->scriptContext = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x166b,"(sym->GetIsGlobal())","sym->GetIsGlobal()");
        if (!bVar5) goto LAB_00762542;
        *(undefined4 *)&(aVar4.this)->scriptContext = 0;
      }
      propertyId = Symbol::EnsurePosition(pSVar15,this);
      index = FuncInfo::FindOrAddReferencedPropertyId(this_00,propertyId);
      Js::ByteCodeWriter::ElementRootU(&this->m_writer,EnsureNoRootFld,index);
      pPVar9 = ParseNode::AsParseNodeVar(pPVar2);
      ppPVar10 = &pPVar9->pnodeNext;
    }
  }
  ppPVar10 = &pnodeBlock->pnodeScopes;
  local_50.this = this;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_007622da:
  do {
    pPVar2 = *ppPVar10;
    while( true ) {
      if (pPVar2 == (ParseNode *)0x0) {
        ppPVar10 = &funcInfo->root->pnodeVars;
        goto LAB_007623c4;
      }
      OVar1 = pPVar2->nop;
      if (OVar1 == knopCatch) {
        pPVar11 = ParseNode::AsParseNodeCatch(pPVar2);
        ppPVar10 = &pPVar11->pnodeNext;
        goto LAB_007622da;
      }
      if (OVar1 == knopBlock) {
        pPVar12 = ParseNode::AsParseNodeBlock(pPVar2);
        ppPVar10 = &pPVar12->pnodeNext;
        goto LAB_007622da;
      }
      if (OVar1 == knopWith) {
        pPVar14 = ParseNode::AsParseNodeWith(pPVar2);
        ppPVar10 = &pPVar14->pnodeNext;
        goto LAB_007622da;
      }
      if (OVar1 == knopFncDecl) break;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x16a8,"((0))","UNREACHED");
      if (!bVar5) goto LAB_00762542;
      *puVar7 = 0;
    }
    pPVar13 = ParseNode::AsParseNodeFnc(pPVar2);
    if ((pPVar13->fncFlags & kFunctionDeclaration) != kFunctionNone) {
      pPVar13 = ParseNode::AsParseNodeFnc(pPVar2);
      EnsureNoRedeclarations::anon_class_8_1_8991fb9c::operator()
                (&local_50,pPVar13->pnodeName->sym,funcInfo,true);
    }
    pPVar13 = ParseNode::AsParseNodeFnc(pPVar2);
    ppPVar10 = &pPVar13->pnodeNext;
  } while( true );
LAB_007623c4:
  pPVar2 = *ppPVar10;
  if (pPVar2 == (ParseNode *)0x0) {
    return;
  }
  pPVar9 = ParseNode::AsParseNodeVar(pPVar2);
  pSVar15 = pPVar9->sym;
  if (pSVar15 == (Symbol *)0x0) goto LAB_00762522;
  pPVar9 = ParseNode::AsParseNodeVar(pPVar2);
  if (pPVar9->isBlockScopeFncDeclVar != '\0') goto LAB_00762522;
  bVar5 = Symbol::IsSpecialSymbol(pSVar15);
  if (bVar5) goto LAB_00762522;
  uVar6 = *(ushort *)&pSVar15->field_0x42;
  if ((uVar6 & 0x40) == 0) {
    if (((uVar6 & 2) != 0) && (pPVar2->nop == knopVarDecl)) {
      if (funcInfo->bodyScope == pSVar15->scope) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x16bc,"(sym->GetIsCatch() || funcInfo->bodyScope != sym->GetScope())",
                           "sym->GetIsCatch() || funcInfo->bodyScope != sym->GetScope()");
        if (bVar5) {
          *puVar7 = 0;
          goto LAB_0076246c;
        }
        goto LAB_00762542;
      }
      goto LAB_0076246c;
    }
  }
  else {
LAB_0076246c:
    pSVar15 = Scope::FindLocalSymbol(funcInfo->bodyScope,&pSVar15->name);
    if ((pSVar15 == (Symbol *)0x0) || (uVar6 = *(ushort *)&pSVar15->field_0x42, (uVar6 & 0x42) != 0)
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x16be,"(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar())",
                         "sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()");
      if (!bVar5) goto LAB_00762542;
      *puVar7 = 0;
      uVar6 = *(ushort *)&pSVar15->field_0x42;
    }
  }
  if ((uVar6 & 8) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x16c1,"(sym->GetIsGlobal())","sym->GetIsGlobal()");
    if (!bVar5) goto LAB_00762542;
    *puVar7 = 0;
  }
  if (pSVar15->symbolType == STVariable) {
    EnsureNoRedeclarations::anon_class_8_1_8991fb9c::operator()(&local_50,pSVar15,funcInfo,false);
  }
LAB_00762522:
  pPVar9 = ParseNode::AsParseNodeVar(pPVar2);
  ppPVar10 = &pPVar9->pnodeNext;
  goto LAB_007623c4;
}

Assistant:

void ByteCodeGenerator::EnsureNoRedeclarations(ParseNodeBlock *pnodeBlock, FuncInfo *funcInfo)
{
    // Emit dynamic runtime checks for variable re-declarations. Only necessary for global functions (script or eval).
    // In eval only var declarations can cause redeclaration, and only in non-strict mode, because let/const variables
    // remain local to the eval code.

    Assert(pnodeBlock->nop == knopBlock);
    Assert(pnodeBlock->blockType == PnodeBlockType::Global || pnodeBlock->scope->GetScopeType() == ScopeType_GlobalEvalBlock);

    if (!(this->flags & fscrEvalCode))
    {
        IterateBlockScopedVariables(pnodeBlock, [this](ParseNode *pnode)
        {
            FuncInfo *funcInfo = this->TopFuncInfo();
            Symbol *sym = pnode->AsParseNodeVar()->sym;

            Assert(sym->GetIsGlobal());

            Js::PropertyId propertyId = sym->EnsurePosition(this);

            this->m_writer.ElementRootU(Js::OpCode::EnsureNoRootFld, funcInfo->FindOrAddReferencedPropertyId(propertyId));
        });
    }

    auto emitRedeclCheck = [this](Symbol * sym, FuncInfo * funcInfo, bool isFncDecl = false)
    {
        Js::PropertyId propertyId = sym->EnsurePosition(this);

        // Global function declarations must pass #sec-candeclareglobalfunction
        // which is enforced by EnsureCanDeclGloFunc
        if (isFncDecl)
        {
            this->m_writer.ElementRootU(Js::OpCode::EnsureCanDeclGloFunc, funcInfo->FindOrAddReferencedPropertyId(propertyId));
        }

        if (this->flags & fscrEval)
        {
            if (!funcInfo->byteCodeFunction->GetIsStrictMode())
            {
                this->m_writer.ScopedProperty(Js::OpCode::ScopedEnsureNoRedeclFld, ByteCodeGenerator::RootObjectRegister,
                    funcInfo->FindOrAddReferencedPropertyId(propertyId));
            }
        }
        else
        {
            this->m_writer.ElementRootU(Js::OpCode::EnsureNoRootRedeclFld, funcInfo->FindOrAddReferencedPropertyId(propertyId));
        }
    };

    // scan for function declarations
    // these behave like "var" declarations
    for (ParseNodePtr pnode = pnodeBlock->pnodeScopes; pnode;)
    {
        switch (pnode->nop) {

        case knopFncDecl:
            if (pnode->AsParseNodeFnc()->IsDeclaration())
            {
                emitRedeclCheck(pnode->AsParseNodeFnc()->pnodeName->sym, funcInfo, true);
            }

            pnode = pnode->AsParseNodeFnc()->pnodeNext;
            break;

        case knopBlock:
            pnode = pnode->AsParseNodeBlock()->pnodeNext;
            break;

        case knopCatch:
            pnode = pnode->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;

        default:
            Assert(UNREACHED);
        }
    }

    // scan for var declarations
    for (ParseNode *pnode = funcInfo->root->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
    {
        Symbol* sym = pnode->AsParseNodeVar()->sym;

        if (sym == nullptr || pnode->AsParseNodeVar()->isBlockScopeFncDeclVar || sym->IsSpecialSymbol())
            continue;

        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
        {
            // The init node was bound to the catch object, because it's inside a catch and has the
            // same name as the catch object. But we want to define a user var at function scope,
            // so find the right symbol. (We'll still assign the RHS value to the catch object symbol.)
            // This also applies to a var declaration in the same scope as a let declaration.

            // Assert that catch cannot be at function scope and let and var at function scope is redeclaration error.
            Assert(sym->GetIsCatch() || funcInfo->bodyScope != sym->GetScope());
            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
            Assert(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar());
        }

        Assert(sym->GetIsGlobal());

        if (sym->GetSymbolType() == STVariable)
        {
            emitRedeclCheck(sym, funcInfo);
        }
    }
}